

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::ImageSamplingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,ImageSamplingInstance *this)

{
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> data;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  deUint32 queueFamilyIndex;
  VkPhysicalDeviceProperties *pVVar5;
  TestTexture *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MovePtr *this_00;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  reference this_01;
  RefBase<vk::Handle<(vk::HandleType)9>_> *this_02;
  Handle<(vk::HandleType)9> *pHVar7;
  TextureLevel *this_03;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *this_04;
  float fVar10;
  float fVar11;
  VkImage image;
  VkFormat format;
  uint in_stack_fffffffffffff5f4;
  undefined4 uVar12;
  LookupPrecision *lookupPrecision_00;
  byte local_9c1;
  bool local_91a;
  bool local_919;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  undefined4 local_888;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  string local_858;
  allocator<char> local_831;
  string local_830;
  LogImage local_810;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  LogImage local_730;
  MessageBuilder local_6a0;
  Vector<float,_4> local_520;
  undefined1 local_510 [8];
  LookupPrecision relaxedPrecision;
  bool compareOk;
  undefined1 local_4b8 [8];
  ConstPixelBufferAccess resultAccess;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_488;
  PtrData<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *local_478;
  undefined1 local_468 [8];
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  int imgNdx;
  TextureFormat local_440;
  Vector<float,_4> local_434;
  Vector<int,_4> local_424;
  Vector<float,_4> local_414;
  tcu local_404 [8];
  float afStack_3fc [2];
  Vector<bool,_4> local_3f4;
  Vector<int,_3> local_3f0;
  Vector<int,_3> local_3e4;
  undefined1 local_3d8 [8];
  LookupPrecision lookupPrecision;
  bool allowSnorm8Bug;
  PixelBufferAccess errorAccess;
  undefined1 local_378 [8];
  TextureLevel errorMask;
  undefined1 local_328 [8];
  ConstPixelBufferAccess coordAccess;
  VkImageSubresourceRange subresource;
  Vec2 lodBounds;
  float lodError;
  float referenceLod;
  Sampler sampler;
  undefined1 local_288 [8];
  RenderState renderState;
  Vec4 lookupBias;
  Vec4 lookupScale;
  bool anyWarnings;
  bool compareOkAll;
  ReferenceRenderer refRenderer;
  undefined1 local_c0 [8];
  Program rrProgram;
  CoordinateCaptureProgram coordCaptureProgram;
  TextureFormat depthStencilFormat;
  TextureFormat colorFormat;
  VkPhysicalDeviceLimits *limits;
  ImageSamplingInstance *this_local;
  
  pVVar5 = Context::getDeviceProperties((this->super_TestInstance).m_context);
  tcu::TextureFormat::TextureFormat(&depthStencilFormat,RGBA,FLOAT);
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)
             &coordCaptureProgram.m_fragmentShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  CoordinateCaptureProgram::CoordinateCaptureProgram
            ((CoordinateCaptureProgram *)&rrProgram.geometryShader);
  CoordinateCaptureProgram::getReferenceProgram
            ((Program *)local_c0,(CoordinateCaptureProgram *)&rrProgram.geometryShader);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  uVar3 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  ReferenceRenderer::ReferenceRenderer
            ((ReferenceRenderer *)(lookupScale.m_data + 3),uVar2,uVar3,1,&depthStencilFormat,
             (TextureFormat *)
             &coordCaptureProgram.m_fragmentShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Program *)local_c0);
  lookupScale.m_data[2]._3_1_ = 1;
  lookupScale.m_data[2]._2_1_ = 0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(lookupBias.m_data + 2),1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderState.restart.restartIndex,0.0);
  getLookupScaleBias(this->m_imageFormat,(Vec4 *)(lookupBias.m_data + 2),
                     (Vec4 *)&renderState.restart.restartIndex);
  ReferenceRenderer::getViewportState
            ((ViewportState *)&sampler.seamlessCubeMap,(ReferenceRenderer *)(lookupScale.m_data + 3)
            );
  rr::RenderState::RenderState
            ((RenderState *)local_288,(ViewportState *)&sampler.seamlessCubeMap,
             VIEWPORTORIENTATION_LOWER_LEFT);
  ReferenceRenderer::draw
            ((ReferenceRenderer *)(lookupScale.m_data + 3),(RenderState *)local_288,
             PRIMITIVETYPE_TRIANGLES,&this->m_vertices);
  ::vk::mapVkSampler((Sampler *)&lodError,&this->m_samplerParams);
  fVar10 = de::clamp<float>((this->m_samplerParams).mipLodBias + this->m_samplerLod,
                            (this->m_samplerParams).minLod,(this->m_samplerParams).maxLod);
  fVar11 = 1.0 / (float)((1 << ((byte)(pVVar5->limits).mipmapPrecisionBits & 0x1f)) - 1);
  tcu::Vector<float,_2>::Vector
            ((Vector<float,_2> *)&subresource.baseArrayLayer,fVar10 - fVar11,fVar10 + fVar11);
  pTVar6 = de::details::
           UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
           operator*(&(this->m_texture).
                      super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                    );
  pipeline::anon_unknown_0::resolveSubresourceRange
            ((VkImageSubresourceRange *)&coordAccess.m_data,pTVar6,&this->m_subresourceRange);
  ReferenceRenderer::getAccess
            ((PixelBufferAccess *)&errorMask.m_data.m_cap,
             (ReferenceRenderer *)(lookupScale.m_data + 3));
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_328,(ConstPixelBufferAccess *)&errorMask.m_data.m_cap);
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)&errorAccess.super_ConstPixelBufferAccess.m_data,RGBA,UNORM_INT8);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  uVar3 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_378,
             (TextureFormat *)&errorAccess.super_ConstPixelBufferAccess.m_data,uVar2,uVar3,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&lookupPrecision.colorMask,(TextureLevel *)local_378);
  pTVar6 = de::details::
           UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                     );
  iVar4 = (*pTVar6->_vptr_TestTexture[0xe])();
  local_919 = false;
  if (*(int *)(CONCAT44(extraout_var,iVar4) + 4) == 0) {
    local_91a = true;
    if ((this->m_samplerParams).minFilter != VK_FILTER_LINEAR) {
      local_91a = (this->m_samplerParams).magFilter == VK_FILTER_LINEAR;
    }
    local_919 = local_91a;
  }
  lookupPrecision.colorThreshold.m_data[3]._3_1_ = local_919;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_3d8);
  tcu::Vector<int,_3>::Vector(&local_3e4,0x11,0x11,0x11);
  lookupPrecision.coordBits.m_data[0] = local_3e4.m_data[2];
  local_3d8._0_4_ = local_3e4.m_data[0];
  local_3d8._4_4_ = local_3e4.m_data[1];
  tcu::Vector<int,_3>::Vector(&local_3f0,5,5,5);
  lookupPrecision.uvwBits.m_data[0] = local_3f0.m_data[2];
  lookupPrecision.coordBits.m_data[1] = local_3f0.m_data[0];
  lookupPrecision.coordBits.m_data[2] = local_3f0.m_data[1];
  tcu::Vector<bool,_4>::Vector(&local_3f4,true);
  lookupPrecision.colorThreshold.m_data[2] = (float)local_3f4.m_data;
  tcu::Vector<int,_4>::Vector(&local_424,8,8,8,8);
  tcu::computeFixedPointThreshold((tcu *)&local_414,&local_424);
  pipeline::anon_unknown_0::swizzleScaleBias
            ((anon_unknown_0 *)&local_434,(Vec4 *)(lookupBias.m_data + 2),&this->m_componentMapping)
  ;
  tcu::operator/(local_404,&local_414,&local_434);
  lookupPrecision.uvwBits.m_data._4_8_ = local_404;
  lookupPrecision.colorThreshold.m_data[0] = afStack_3fc[0];
  lookupPrecision.colorThreshold.m_data[1] = afStack_3fc[1];
  pTVar6 = de::details::
           UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                     );
  iVar4 = (*pTVar6->_vptr_TestTexture[0xe])();
  local_440 = *(TextureFormat *)CONCAT44(extraout_var_00,iVar4);
  bVar1 = tcu::isSRGB(local_440);
  if (bVar1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffffbb0,0.015686275);
    tcu::Vector<float,_4>::operator+=
              ((Vector<float,_4> *)(lookupPrecision.uvwBits.m_data + 1),
               (Vector<float,_4> *)&stack0xfffffffffffffbb0);
  }
  lookupPrecision_00 = (LookupPrecision *)((ulong)in_stack_fffffffffffff5f4 << 0x20);
  for (result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
       _12_4_ = 0;
      (int)result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data
           ._12_4_ < this->m_imageCount;
      result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
      _12_4_ = result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
               m_data._12_4_ + 1) {
    this_00 = (MovePtr *)Context::getDeviceInterface((this->super_TestInstance).m_context);
    device = Context::getDevice((this->super_TestInstance).m_context);
    queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
    allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
    uVar12 = (undefined4)((ulong)lookupPrecision_00 >> 0x20);
    this_01 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
              ::operator[](&this->m_colorImages,
                           (long)(int)result.
                                      super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                                      .m_data._12_4_);
    this_02 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::operator*
                         (this_01)->super_RefBase<vk::Handle<(vk::HandleType)9>_>;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*(this_02);
    image.m_internal = pHVar7->m_internal;
    format = this->m_colorFormat;
    resultAccess.m_data = (void *)image.m_internal;
    readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                        &local_488,(DeviceInterface *)this_00,device,queue,queueFamilyIndex,
                        allocator,image,format,&this->m_renderSize);
    local_478 = de::details::MovePtr::operator_cast_to_PtrData(&local_488,this_00);
    data._8_4_ = format;
    data.ptr = (TextureLevel *)image.m_internal;
    data._12_4_ = uVar12;
    de::details::UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::UniquePtr
              ((UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_468,
               data);
    de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
              ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_488);
    this_03 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
              operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                         local_468);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&relaxedPrecision.colorMask,this_03);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_4b8,
               (ConstPixelBufferAccess *)&relaxedPrecision.colorMask);
    pTVar6 = de::details::
             UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             ::operator*(&(this->m_texture).
                          super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                        );
    lookupPrecision_00 = (LookupPrecision *)local_3d8;
    relaxedPrecision.colorThreshold.m_data[3]._3_1_ =
         pipeline::anon_unknown_0::validateResultImage
                   (pTVar6,this->m_imageViewType,(VkImageSubresourceRange *)&coordAccess.m_data,
                    (Sampler *)&lodError,&this->m_componentMapping,
                    (ConstPixelBufferAccess *)local_328,(Vec2 *)&subresource.baseArrayLayer,
                    lookupPrecision_00,(Vec4 *)(lookupBias.m_data + 2),
                    (Vec4 *)&renderState.restart.restartIndex,(ConstPixelBufferAccess *)local_4b8,
                    (PixelBufferAccess *)&lookupPrecision.colorMask);
    if ((!(bool)relaxedPrecision.colorThreshold.m_data[3]._3_1_) &&
       ((lookupPrecision.colorThreshold.m_data[3]._3_1_ & 1) != 0)) {
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_510);
      tcu::Vector<float,_4>::Vector(&local_520,0.015686275);
      tcu::Vector<float,_4>::operator+=
                ((Vector<float,_4> *)(relaxedPrecision.uvwBits.m_data + 1),&local_520);
      pTVar8 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar9 = tcu::TestContext::getLog(pTVar8);
      tcu::TestLog::operator<<(&local_6a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      this_04 = tcu::MessageBuilder::operator<<
                          (&local_6a0,
                           (char (*) [84])
                           "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
                          );
      tcu::MessageBuilder::operator<<(this_04,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6a0);
      lookupScale.m_data[2]._2_1_ = 1;
      pTVar6 = de::details::
               UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
               ::operator*(&(this->m_texture).
                            super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                          );
      lookupPrecision_00 = (LookupPrecision *)local_510;
      relaxedPrecision.colorThreshold.m_data[3]._3_1_ =
           pipeline::anon_unknown_0::validateResultImage
                     (pTVar6,this->m_imageViewType,(VkImageSubresourceRange *)&coordAccess.m_data,
                      (Sampler *)&lodError,&this->m_componentMapping,
                      (ConstPixelBufferAccess *)local_328,(Vec2 *)&subresource.baseArrayLayer,
                      lookupPrecision_00,(Vec4 *)(lookupBias.m_data + 2),
                      (Vec4 *)&renderState.restart.restartIndex,(ConstPixelBufferAccess *)local_4b8,
                      (PixelBufferAccess *)&lookupPrecision.colorMask);
    }
    if ((bool)relaxedPrecision.colorThreshold.m_data[3]._3_1_ == false) {
      pTVar8 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar9 = tcu::TestContext::getLog(pTVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Result",&local_751);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_778,"Result Image",&local_779);
      tcu::LogImage::LogImage
                (&local_730,&local_750,&local_778,(ConstPixelBufferAccess *)local_4b8,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_730);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_830,"ErrorMask",&local_831);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,"Error Mask",&local_859);
      tcu::LogImage::LogImage
                (&local_810,&local_830,&local_858,
                 (ConstPixelBufferAccess *)&lookupPrecision.colorMask,QP_IMAGE_COMPRESSION_MODE_BEST
                );
      tcu::TestLog::operator<<(pTVar9,&local_810);
      tcu::LogImage::~LogImage(&local_810);
      std::__cxx11::string::~string((string *)&local_858);
      std::allocator<char>::~allocator(&local_859);
      std::__cxx11::string::~string((string *)&local_830);
      std::allocator<char>::~allocator(&local_831);
      tcu::LogImage::~LogImage(&local_730);
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator(&local_779);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator(&local_751);
    }
    local_9c1 = 0;
    if ((lookupScale.m_data[2]._3_1_ & 1) != 0) {
      local_9c1 = relaxedPrecision.colorThreshold.m_data[3]._3_1_;
    }
    lookupScale.m_data[2]._3_1_ = local_9c1 & 1;
    de::details::UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniquePtr
              ((UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_468);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_378);
  if ((lookupScale.m_data[2]._3_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,"Image mismatch",&local_8d1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
  }
  else if ((lookupScale.m_data[2]._2_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a8,"Result image matches reference",&local_8a9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_8a8);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator(&local_8a9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_880,"Inaccurate filtering results",&local_881);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_880);
    std::__cxx11::string::~string((string *)&local_880);
    std::allocator<char>::~allocator(&local_881);
  }
  local_888 = 1;
  ReferenceRenderer::~ReferenceRenderer((ReferenceRenderer *)(lookupScale.m_data + 3));
  CoordinateCaptureProgram::~CoordinateCaptureProgram
            ((CoordinateCaptureProgram *)&rrProgram.geometryShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSamplingInstance::verifyImage (void)
{
	const VkPhysicalDeviceLimits&		limits					= m_context.getDeviceProperties().limits;
	// \note Color buffer is used to capture coordinates - not sampled texture values
	const tcu::TextureFormat			colorFormat				(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
	const tcu::TextureFormat			depthStencilFormat;		// Undefined depth/stencil format.
	const CoordinateCaptureProgram		coordCaptureProgram;
	const rr::Program					rrProgram				= coordCaptureProgram.getReferenceProgram();
	ReferenceRenderer					refRenderer				(m_renderSize.x(), m_renderSize.y(), 1, colorFormat, depthStencilFormat, &rrProgram);

	bool								compareOkAll			= true;
	bool								anyWarnings				= false;

	tcu::Vec4							lookupScale				(1.0f);
	tcu::Vec4							lookupBias				(0.0f);

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	// Render out coordinates
	{
		const rr::RenderState renderState(refRenderer.getViewportState());
		refRenderer.draw(renderState, rr::PRIMITIVETYPE_TRIANGLES, m_vertices);
	}

	// Verify results
	{
		const tcu::Sampler					sampler			= mapVkSampler(m_samplerParams);
		const float							referenceLod	= de::clamp(m_samplerParams.mipLodBias + m_samplerLod, m_samplerParams.minLod, m_samplerParams.maxLod);
		const float							lodError		= 1.0f / static_cast<float>((1u << limits.mipmapPrecisionBits) - 1u);
		const tcu::Vec2						lodBounds		(referenceLod - lodError, referenceLod + lodError);
		const vk::VkImageSubresourceRange	subresource		= resolveSubresourceRange(*m_texture, m_subresourceRange);

		const tcu::ConstPixelBufferAccess	coordAccess		= refRenderer.getAccess();
		tcu::TextureLevel					errorMask		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), (int)m_renderSize.x(), (int)m_renderSize.y());
		const tcu::PixelBufferAccess		errorAccess		= errorMask.getAccess();

		const bool							allowSnorm8Bug	= m_texture->getTextureFormat().type == tcu::TextureFormat::SNORM_INT8 &&
															  (m_samplerParams.minFilter == VK_FILTER_LINEAR || m_samplerParams.magFilter == VK_FILTER_LINEAR);

		tcu::LookupPrecision				lookupPrecision;

		// Set precision requirements - very low for these tests as
		// the point of the test is not to validate accuracy.
		lookupPrecision.coordBits		= tcu::IVec3(17, 17, 17);
		lookupPrecision.uvwBits			= tcu::IVec3(5, 5, 5);
		lookupPrecision.colorMask		= tcu::BVec4(true);
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(tcu::IVec4(8, 8, 8, 8)) / swizzleScaleBias(lookupScale, m_componentMapping);

		if (tcu::isSRGB(m_texture->getTextureFormat()))
			lookupPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

		for (int imgNdx = 0; imgNdx < m_imageCount; ++imgNdx)
		{
			// Read back result image
			UniquePtr<tcu::TextureLevel>		result			(readColorAttachment(m_context.getDeviceInterface(),
																					 m_context.getDevice(),
																					 m_context.getUniversalQueue(),
																					 m_context.getUniversalQueueFamilyIndex(),
																					 m_context.getDefaultAllocator(),
																					 **m_colorImages[imgNdx],
																					 m_colorFormat,
																					 m_renderSize));
			const tcu::ConstPixelBufferAccess	resultAccess	= result->getAccess();
			bool								compareOk		= validateResultImage(*m_texture,
																					  m_imageViewType,
																					  subresource,
																					  sampler,
																					  m_componentMapping,
																					  coordAccess,
																					  lodBounds,
																					  lookupPrecision,
																					  lookupScale,
																					  lookupBias,
																					  resultAccess,
																					  errorAccess);

			if (!compareOk && allowSnorm8Bug)
			{
				// HW waiver (VK-GL-CTS issue: 229)
				//
				// Due to an error in bit replication of the fixed point SNORM values, linear filtered
				// negative SNORM values will differ slightly from ideal precision in the last bit, moving
				// the values towards 0.
				//
				// This occurs on all members of the PowerVR Rogue family of GPUs
				tcu::LookupPrecision	relaxedPrecision;

				relaxedPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
					<< tcu::TestLog::EndMessage;
				anyWarnings = true;

				compareOk = validateResultImage(*m_texture,
												m_imageViewType,
												subresource,
												sampler,
												m_componentMapping,
												coordAccess,
												lodBounds,
												relaxedPrecision,
												lookupScale,
												lookupBias,
												resultAccess,
												errorAccess);
			}

			if (!compareOk)
				m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Result", "Result Image", resultAccess)
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorAccess);

			compareOkAll = compareOkAll && compareOk;
		}
	}

	if (compareOkAll)
	{
		if (anyWarnings)
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Inaccurate filtering results");
		else
			return tcu::TestStatus::pass("Result image matches reference");
	}
	else
		return tcu::TestStatus::fail("Image mismatch");
}